

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

termline * decompressline(compressed_scrollback_line *line)

{
  byte bVar1;
  termline *ldata_00;
  termchar *ptVar2;
  ptrlen data;
  uint local_68;
  wchar_t local_64;
  wchar_t lattr;
  wchar_t i;
  termline *ldata;
  BinarySource bs [1];
  wchar_t shift;
  wchar_t byte;
  wchar_t ncols;
  compressed_scrollback_line *line_local;
  
  data = make_ptrlen(line + 1,line->len);
  BinarySource_INIT__((BinarySource *)&ldata,data);
  bs[0].binarysource_._4_4_ = 0;
  shift = L'\0';
  do {
    bVar1 = BinarySource_get_byte((BinarySource *)bs[0]._24_8_);
    shift = (bVar1 & 0x7f) << ((byte)bs[0].binarysource_._4_4_ & 0x1f) | shift;
    bs[0].binarysource_._4_4_ = bs[0].binarysource_._4_4_ + 7;
  } while ((bVar1 & 0x80) != 0);
  ldata_00 = (termline *)safemalloc(1,0x28,0);
  ptVar2 = (termchar *)safemalloc((long)shift,0x20,0);
  ldata_00->chars = ptVar2;
  ldata_00->size = shift;
  ldata_00->cols = shift;
  ldata_00->temporary = true;
  ldata_00->cc_free = L'\0';
  for (local_64 = L'\0'; local_64 < ldata_00->cols; local_64 = local_64 + L'\x01') {
    ldata_00->chars[local_64].cc_next = L'\0';
  }
  bs[0].binarysource_._4_4_ = 0;
  local_68 = 0;
  do {
    bVar1 = BinarySource_get_byte((BinarySource *)bs[0]._24_8_);
    local_68 = (bVar1 & 0x7f) << ((byte)bs[0].binarysource_._4_4_ & 0x1f) | local_68;
    bs[0].binarysource_._4_4_ = bs[0].binarysource_._4_4_ + 7;
  } while ((bVar1 & 0x80) != 0);
  ldata_00->lattr = (unsigned_short)local_68;
  ldata_00->trusted = (local_68 & 0x10000) != 0;
  readrle((BinarySource *)&ldata,ldata_00,readliteral_chr);
  readrle((BinarySource *)&ldata,ldata_00,readliteral_attr);
  readrle((BinarySource *)&ldata,ldata_00,readliteral_truecolour);
  readrle((BinarySource *)&ldata,ldata_00,readliteral_cc);
  if (*(int *)(bs[0]._24_8_ + 0x18) == 0) {
    if (*(long *)(bs[0]._24_8_ + 0x10) == *(long *)(bs[0]._24_8_ + 8)) {
      return ldata_00;
    }
    __assert_fail("get_avail(bs) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x3da,"termline *decompressline(compressed_scrollback_line *)");
  }
  __assert_fail("!get_err(bs)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                ,0x3d9,"termline *decompressline(compressed_scrollback_line *)");
}

Assistant:

static termline *decompressline(compressed_scrollback_line *line)
{
    int ncols, byte, shift;
    BinarySource bs[1];
    termline *ldata;

    BinarySource_BARE_INIT(bs, line+1, line->len);

    /*
     * First read in the column count.
     */
    ncols = shift = 0;
    do {
        byte = get_byte(bs);
        ncols |= (byte & 0x7F) << shift;
        shift += 7;
    } while (byte & 0x80);

    /*
     * Now create the output termline.
     */
    ldata = snew(termline);
    ldata->chars = snewn(ncols, termchar);
    ldata->cols = ldata->size = ncols;
    ldata->temporary = true;
    ldata->cc_free = 0;

    /*
     * We must set all the cc pointers in ldata->chars to 0 right
     * now, so that cc diagnostics that verify the integrity of the
     * whole line will make sense while we're in the middle of
     * building it up.
     */
    {
        int i;
        for (i = 0; i < ldata->cols; i++)
            ldata->chars[i].cc_next = 0;
    }

    /*
     * Now read in the lattr.
     */
    int lattr = shift = 0;
    do {
        byte = get_byte(bs);
        lattr |= (byte & 0x7F) << shift;
        shift += 7;
    } while (byte & 0x80);
    ldata->lattr = lattr & 0xFFFF;
    ldata->trusted = (lattr & 0x10000) != 0;

    /*
     * Now we read in each of the RLE streams in turn.
     */
    readrle(bs, ldata, readliteral_chr);
    readrle(bs, ldata, readliteral_attr);
    readrle(bs, ldata, readliteral_truecolour);
    readrle(bs, ldata, readliteral_cc);

    /* And we always expect that we ended up exactly at the end of the
     * compressed data. */
    assert(!get_err(bs));
    assert(get_avail(bs) == 0);

    return ldata;
}